

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O3

ogt_vox_scene *
ogt_vox_merge_scenes
          (ogt_vox_scene **scenes,uint32_t scene_count,ogt_vox_rgba *required_colors,
          uint32_t required_color_count)

{
  ogt_vox_transform *poVar1;
  bool *pbVar2;
  ogt_vox_rgba *poVar3;
  ogt_vox_rgba oVar4;
  ogt_vox_model **ppoVar5;
  uint8_t *puVar6;
  ogt_vox_group *poVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ogt_vox_instance *poVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ogt_vox_layer *poVar22;
  ogt_vox_model *poVar23;
  ogt_vox_model *poVar24;
  size_t sVar25;
  ogt_vox_scene *poVar26;
  long lVar27;
  ogt_vox_model *poVar28;
  long lVar29;
  uint32_t uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined8 *puVar34;
  uint uVar35;
  uint32_t *puVar36;
  ogt_vox_instance *poVar37;
  int32_t best_score;
  uint32_t color_index_1;
  int iVar38;
  float fVar39;
  size_t __n;
  ogt_vox_scene *__dest;
  uint uVar40;
  int iVar41;
  byte bVar42;
  float fVar43;
  float fVar44;
  uint32_t num_instances;
  uint32_t base_model_index;
  bool scene_used_mask [256];
  ogt_vox_rgba master_palette [256];
  uint32_t scene_color_index_to_master_map [256];
  ogt_vox_matl materials [256];
  uint local_4a84;
  uint local_4a7c;
  ogt_vox_scene *local_4a78;
  long local_4a70;
  float local_4a64;
  ulong local_4a60;
  ulong local_4a58;
  ogt_vox_instance *local_4a50;
  ogt_vox_scene *local_4a48;
  uint local_4a3c;
  undefined8 local_4a38;
  undefined8 uStack_4a30;
  ulong local_4a28;
  ulong local_4a20;
  ogt_vox_model **local_4a18;
  ulong local_4a10;
  ulong local_4a08;
  ogt_vox_model **local_4a00;
  ogt_vox_group *local_49f8;
  uint32_t *local_49f0;
  ulong local_49e8;
  ogt_vox_scene **local_49e0;
  undefined8 local_49d8;
  float local_49d0;
  _vox_array<unsigned_int> local_49c8;
  _vox_array<unsigned_int> local_49a8;
  ogt_vox_layer *local_4988;
  ogt_vox_instance *local_4980;
  ogt_vox_transform local_4978;
  ogt_vox_transform local_4938 [3];
  undefined4 uStack_483c;
  ogt_vox_rgba local_4838;
  byte local_4834;
  uint8_t local_4833 [1019];
  undefined4 local_4438;
  uint local_4434 [255];
  undefined8 local_4038 [2049];
  
  bVar42 = 0;
  local_49e0 = scenes;
  if (0xff < required_color_count) {
    __assert_fail("(required_color_count <= 255) && (\"too many colors specified\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xb6c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  uVar31 = (ulong)scene_count;
  local_4a58 = 0;
  memset(&local_4838,0,0x400);
  memset(local_4038,0,0x4000);
  local_4a84 = 1;
  uVar33 = 1;
  if (required_color_count != 0) {
    memcpy(&local_4834,required_colors,(ulong)(required_color_count * 4));
    uVar33 = (ulong)(required_color_count + 1);
  }
  local_49e8 = uVar31;
  if (scene_count == 0) {
    local_4a50 = (ogt_vox_instance *)0x0;
    local_4a10 = 0;
  }
  else {
    local_4a84 = 1;
    uVar21 = 0;
    uVar40 = 0;
    local_4a58 = 0;
    do {
      poVar26 = local_49e0[uVar21];
      if (poVar26 != (ogt_vox_scene *)0x0) {
        local_4a58 = (ulong)((int)local_4a58 + poVar26->num_instances);
        uVar40 = uVar40 + poVar26->num_models;
        local_4a84 = local_4a84 + poVar26->num_groups;
      }
      uVar21 = uVar21 + 1;
    } while (uVar31 != uVar21);
    local_4a10 = 0;
    if ((int)local_4a58 == 0) {
      local_4a58 = 0;
      local_4a50 = (ogt_vox_instance *)0x0;
    }
    else {
      local_4a50 = (ogt_vox_instance *)(*g_alloc_func)(local_4a58 * 0x78);
    }
    if (uVar40 != 0) {
      local_4a18 = (ogt_vox_model **)(*g_alloc_func)((ulong)uVar40 << 3);
      local_4a10 = (ulong)uVar40;
      goto LAB_00107ed1;
    }
  }
  local_4a18 = (ogt_vox_model **)0x0;
LAB_00107ed1:
  poVar22 = (ogt_vox_layer *)(*g_alloc_func)(0x10);
  local_49f8 = (ogt_vox_group *)(*g_alloc_func)((ulong)local_4a84 * 0x68);
  local_4a7c = 0;
  poVar22->hidden = false;
  (poVar22->color).r = 0xff;
  (poVar22->color).g = 0xff;
  (poVar22->color).b = 0xff;
  (poVar22->color).a = 0xff;
  poVar22->name = "merged";
  local_49f8->name = (char *)0x0;
  (local_49f8->transform).m00 = 1.0;
  (local_49f8->transform).m01 = 0.0;
  (local_49f8->transform).m02 = 0.0;
  (local_49f8->transform).m03 = 0.0;
  (local_49f8->transform).m10 = 0.0;
  (local_49f8->transform).m11 = 1.0;
  (local_49f8->transform).m12 = 0.0;
  (local_49f8->transform).m13 = 0.0;
  (local_49f8->transform).m20 = 0.0;
  (local_49f8->transform).m21 = 0.0;
  (local_49f8->transform).m22 = 1.0;
  (local_49f8->transform).m23 = 0.0;
  (local_49f8->transform).m30 = 0.0;
  (local_49f8->transform).m31 = 0.0;
  (local_49f8->transform).m32 = 0.0;
  *(undefined8 *)&(local_49f8->transform).m33 = 0xffffffff3f800000;
  local_49f8->layer_index = 0;
  local_49f8->hidden = false;
  (local_49f8->transform_anim).keyframes = (ogt_vox_keyframe_transform *)0x0;
  (local_49f8->transform_anim).num_keyframes = 0;
  (local_49f8->transform_anim).loop = false;
  local_49a8.count = 0;
  local_49a8.data = (uint *)0x0;
  local_49a8.capacity = 0;
  local_4a48 = (ogt_vox_scene *)0x0;
  local_49c8.count = 0;
  local_49c8.data = (uint *)0x0;
  local_49c8.capacity = 0;
  local_4988 = poVar22;
  if (scene_count == 0) {
    uVar40 = 1;
    local_4a70 = 0;
  }
  else {
    local_4a60 = 1;
    uVar31 = 0;
    local_4a70 = 0;
    local_4a28 = 0;
    do {
      poVar26 = local_49e0[uVar31];
      local_4a08 = uVar31;
      if (poVar26 != (ogt_vox_scene *)0x0) {
        memset(local_4938,0,0x100);
        uVar40 = poVar26->num_models;
        if ((ulong)uVar40 != 0) {
          ppoVar5 = poVar26->models;
          uVar31 = 0;
          do {
            poVar24 = ppoVar5[uVar31];
            uVar35 = poVar24->size_y * poVar24->size_x * poVar24->size_z;
            if (uVar35 != 0) {
              puVar6 = poVar24->voxel_data;
              uVar21 = 0;
              do {
                *(undefined1 *)((long)&local_4938[0].m00 + (ulong)puVar6[uVar21]) = 1;
                uVar21 = uVar21 + 1;
              } while (uVar35 != uVar21);
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar40);
        }
        local_4438 = 0;
        memset(local_4434,0xff,0x3fc);
        lVar27 = 1;
        do {
          uVar40 = (uint)uVar33;
          if (*(char *)((long)&local_4938[0].m00 + lVar27) == '\x01') {
            oVar4 = (poVar26->palette).color[lVar27];
            if (uVar40 < 2) {
LAB_001080c8:
              puVar36 = &(poVar26->materials).matl[lVar27].content_flags;
              (&local_4838)[uVar33] = oVar4;
              uVar9 = *(undefined8 *)(puVar36 + 2);
              uVar10 = *(undefined8 *)(puVar36 + 4);
              uVar11 = *(undefined8 *)(puVar36 + 6);
              uVar12 = *(undefined8 *)(puVar36 + 8);
              uVar13 = *(undefined8 *)(puVar36 + 10);
              uVar14 = *(undefined8 *)(puVar36 + 0xc);
              uVar15 = *(undefined8 *)(puVar36 + 0xe);
              local_4038[uVar33 * 8] = *(undefined8 *)puVar36;
              local_4038[uVar33 * 8 + 1] = uVar9;
              local_4038[uVar33 * 8 + 2] = uVar10;
              local_4038[uVar33 * 8 + 3] = uVar11;
              local_4038[uVar33 * 8 + 4] = uVar12;
              local_4038[uVar33 * 8 + 5] = uVar13;
              local_4038[uVar33 * 8 + 6] = uVar14;
              local_4038[uVar33 * 8 + 7] = uVar15;
              uVar33 = (ulong)(uVar40 + 1);
            }
            else {
              uVar31 = 1;
              do {
                if ((((&local_4838)[uVar31].r == oVar4.r) && ((&local_4838)[uVar31].g == oVar4.g))
                   && ((&local_4838)[uVar31].b == oVar4.b)) {
                  if (uVar31 != 0xffffffff) {
                    uVar40 = (uint)uVar31;
                    goto LAB_00108186;
                  }
                  break;
                }
                uVar31 = uVar31 + 1;
              } while (uVar33 != uVar31);
              if (uVar40 < 0x100) goto LAB_001080c8;
              uVar31 = 1;
              iVar20 = 0x7fffffff;
              uVar21 = 1;
              do {
                iVar19 = ((uint)oVar4 & 0xff) - (uint)(&local_4838)[uVar21].r;
                iVar38 = ((uint)oVar4 >> 8 & 0xff) - (uint)(&local_4838)[uVar21].g;
                iVar41 = ((uint)oVar4 >> 0x10 & 0xff) - (uint)(&local_4838)[uVar21].b;
                iVar19 = iVar41 * iVar41 + iVar38 * iVar38 + iVar19 * iVar19;
                if (iVar19 < iVar20) {
                  uVar31 = uVar21 & 0xffffffff;
                }
                uVar40 = (uint)uVar31;
                if (iVar19 < iVar20) {
                  iVar20 = iVar19;
                }
                uVar21 = uVar21 + 1;
              } while (uVar33 != uVar21);
            }
LAB_00108186:
            local_4434[lVar27 + -1] = uVar40;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x100);
        local_4a3c = (uint)local_4a48;
        _vox_array<unsigned_int>::push_back(&local_49a8,&local_4a3c);
        _vox_array<unsigned_int>::push_back(&local_49c8,&local_4a7c);
        local_4a78 = poVar26;
        if (poVar26->num_models == 0) {
          uVar31 = (ulong)poVar26->num_instances;
LAB_001084b4:
          local_49f0 = &poVar26->num_instances;
          iVar20 = 0;
          fVar39 = 0.0;
        }
        else {
          uVar31 = 0;
          do {
            poVar24 = poVar26->models[uVar31];
            uVar40 = poVar24->size_y * poVar24->size_x * poVar24->size_z;
            uVar21 = (ulong)uVar40;
            poVar23 = (ogt_vox_model *)(*g_alloc_func)(uVar21 + 0x18);
            poVar28 = poVar23 + 1;
            if (uVar21 == 0) {
              uVar30 = poVar24->size_y;
              uVar17 = poVar24->size_z;
              uVar18 = poVar24->voxel_hash;
              poVar23->size_x = poVar24->size_x;
              poVar23->size_y = uVar30;
              poVar23->size_z = uVar17;
              poVar23->voxel_hash = uVar18;
              poVar23->voxel_data = (uint8_t *)poVar28;
LAB_0010826f:
              uVar30 = 0;
            }
            else {
              uVar32 = 0;
              do {
                if (0xff < local_4434[(ulong)poVar24->voxel_data[uVar32] - 1]) {
                  __assert_fail("(new_color_index < 256) && (\"color index out of bounds\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                                ,0xbc4,
                                "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                               );
                }
                *(char *)((long)&poVar23[1].size_x + uVar32) =
                     (char)local_4434[(ulong)poVar24->voxel_data[uVar32] - 1];
                uVar32 = uVar32 + 1;
              } while (uVar21 != uVar32);
              uVar30 = poVar24->size_y;
              uVar17 = poVar24->size_z;
              uVar18 = poVar24->voxel_hash;
              poVar23->size_x = poVar24->size_x;
              poVar23->size_y = uVar30;
              poVar23->size_z = uVar17;
              poVar23->voxel_hash = uVar18;
              poVar23->voxel_data = (uint8_t *)poVar28;
              if (uVar40 == 0) goto LAB_0010826f;
              uVar32 = 0;
              uVar30 = 0;
              do {
                uVar30 = uVar30 * 0x10017 + (uint)*(byte *)((long)&poVar28->size_x + uVar32);
                uVar32 = uVar32 + 1;
              } while (uVar21 != uVar32);
            }
            poVar23->voxel_hash = uVar30;
            uVar21 = (ulong)local_4a48 & 0xffffffff;
            local_4a48 = (ogt_vox_scene *)(ulong)((int)local_4a48 + 1);
            local_4a18[uVar21] = poVar23;
            uVar31 = uVar31 + 1;
          } while (uVar31 < poVar26->num_models);
          local_49f0 = &poVar26->num_instances;
          uVar31 = (ulong)poVar26->num_instances;
          if (uVar31 == 0 || poVar26->num_models == 0) goto LAB_001084b4;
          local_4a00 = poVar26->models;
          local_4980 = poVar26->instances;
          iVar20 = 0x7ffffff;
          uVar21 = 0;
          local_4a20 = uVar31;
          fVar39 = -1.0384595e+34;
          do {
            local_4a64 = fVar39;
            poVar1 = &local_4980[uVar21].transform;
            local_4938[0].m00 = poVar1->m00;
            local_4938[0].m01 = poVar1->m01;
            local_4938[0].m02 = poVar1->m02;
            local_4938[0].m03 = poVar1->m03;
            poVar16 = local_4980 + uVar21;
            local_4938[0].m10 = (poVar16->transform).m10;
            local_4938[0].m11 = (poVar16->transform).m11;
            local_4938[0]._24_8_ = *(undefined8 *)(&(poVar16->transform).m10 + 2);
            poVar16 = local_4980 + uVar21;
            local_4938[0].m20 = (poVar16->transform).m20;
            local_4938[0].m21 = (poVar16->transform).m21;
            local_4938[0]._40_8_ = *(undefined8 *)(&(poVar16->transform).m20 + 2);
            poVar16 = local_4980 + uVar21;
            local_4938[0].m30 = (poVar16->transform).m30;
            local_4938[0].m31 = (poVar16->transform).m31;
            local_4938[0]._56_8_ = *(undefined8 *)(&(poVar16->transform).m30 + 2);
            uVar40 = local_4980[uVar21].group_index;
            local_4a38 = uVar21;
            if (uVar40 != 0xffffffff) {
              poVar7 = local_4a78->groups;
              do {
                ogt_vox_transform_multiply(&local_4978,local_4938,&poVar7[uVar40].transform);
                local_4938[0].m30 = local_4978.m30;
                local_4938[0].m31 = local_4978.m31;
                local_4938[0].m32 = local_4978.m32;
                local_4938[0].m33 = local_4978.m33;
                local_4938[0].m20 = local_4978.m20;
                local_4938[0].m21 = local_4978.m21;
                local_4938[0].m22 = local_4978.m22;
                local_4938[0].m23 = local_4978.m23;
                local_4938[0].m10 = local_4978.m10;
                local_4938[0].m11 = local_4978.m11;
                local_4938[0].m12 = local_4978.m12;
                local_4938[0].m13 = local_4978.m13;
                local_4938[0].m00 = local_4978.m00;
                local_4938[0].m01 = local_4978.m01;
                local_4938[0].m02 = local_4978.m02;
                local_4938[0].m03 = local_4978.m03;
                uVar40 = poVar7[uVar40].parent_group_index;
              } while (uVar40 != 0xffffffff);
            }
            poVar24 = local_4a00[local_4980[uVar21].model_index];
            if ((local_4938[0].m00 == 0.0) && (!NAN(local_4938[0].m00))) {
              if ((local_4938[0].m10 != 0.0) || (NAN(local_4938[0].m10))) {
                poVar24 = (ogt_vox_model *)&poVar24->size_y;
              }
              else if ((local_4938[0].m20 != 0.0) || (NAN(local_4938[0].m20))) {
                poVar24 = (ogt_vox_model *)&poVar24->size_z;
              }
            }
            iVar38 = (int)poVar24->size_x / 2;
            iVar19 = (int)local_4938[0].m30 - iVar38;
            fVar39 = (float)(iVar38 + (int)local_4938[0].m30);
            if (iVar20 <= iVar19) {
              iVar19 = iVar20;
            }
            iVar20 = iVar19;
            if ((int)fVar39 <= (int)local_4a64) {
              fVar39 = local_4a64;
            }
            uVar21 = local_4a38 + 1;
            uVar31 = local_4a20;
            poVar26 = local_4a78;
          } while (uVar21 != local_4a20);
        }
        uVar40 = (uint)uVar31;
        if (poVar26->groups->parent_group_index != 0xffffffff) {
          __assert_fail("(scene->groups[0].parent_group_index == k_invalid_group_index) && (\"first group of scene must not be parented to any other group\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0xbd7,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        uVar35 = (int)local_4a28 - iVar20;
        local_4a28 = (ulong)uVar35;
        fVar43 = (float)(int)uVar35;
        uVar31 = (ulong)poVar26->num_groups;
        iVar20 = (int)local_4a60;
        if (1 < poVar26->num_groups) {
          local_4a20 = (ulong)(iVar20 - 1);
          local_4a00 = (ogt_vox_model **)(local_4a60 & 0xffffffff);
          uVar21 = 1;
          lVar27 = 200;
          do {
            poVar7 = poVar26->groups;
            uVar40 = *(uint *)((long)poVar7 + lVar27 + -0x18);
            if (uVar40 == 0xffffffff) {
              __assert_fail("(src_group->parent_group_index != k_invalid_group_index) && (\"all groups after the first in the scene must be parented to a valid group\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                            ,0xbdb,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            pcVar8 = *(char **)((long)poVar7 + lVar27 + -0x60);
            puVar34 = (undefined8 *)((long)poVar7 + lVar27 + -0x38);
            local_4938[0]._32_8_ = *puVar34;
            local_4938[0]._40_8_ = puVar34[1];
            puVar34 = (undefined8 *)((long)poVar7 + lVar27 + -0x48);
            local_4938[0]._16_8_ = *puVar34;
            local_4938[0]._24_8_ = puVar34[1];
            puVar34 = (undefined8 *)((long)poVar7 + lVar27 + -0x58);
            local_4938[0]._0_8_ = *puVar34;
            local_4938[0]._8_8_ = puVar34[1];
            fVar44 = *(float *)((long)poVar7 + lVar27 + -0x28);
            local_49d0 = *(float *)((long)poVar7 + lVar27 + -0x1c);
            local_49d8 = *(undefined8 *)((long)poVar7 + lVar27 + -0x24);
            puVar34 = (undefined8 *)((long)poVar7 + lVar27 + -0x10);
            local_4978._0_8_ = *puVar34;
            local_4978._8_8_ = puVar34[1];
            if ((uint)uVar31 <= uVar40) {
              __assert_fail("(dst_group.parent_group_index < scene->num_groups) && (\"group index is out of bounds\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                            ,0xbdd,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            local_4a38 = *(ulong *)((long)&poVar7->name + lVar27);
            uStack_4a30 = 0;
            uVar30 = (int)local_4a20 + uVar40;
            if (uVar40 == 0) {
              uVar30 = 0;
            }
            if (pcVar8 != (char *)0x0) {
              local_4a64 = fVar44;
              sVar25 = strlen(pcVar8);
              local_4a70 = local_4a70 + sVar25 + 1;
              fVar44 = local_4a64;
            }
            if (uVar30 == 0) {
              fVar44 = fVar44 + fVar43;
            }
            uVar40 = ((int)local_4a00 + (int)uVar21) - 1;
            local_4a70 = local_4a70 + (local_4a38 & 0xffffffff) * 0x44;
            local_49f8[uVar40].name = pcVar8;
            poVar1 = &local_49f8[uVar40].transform;
            poVar1->m00 = local_4938[0].m00;
            poVar1->m01 = local_4938[0].m01;
            poVar1->m02 = local_4938[0].m02;
            poVar1->m03 = local_4938[0].m03;
            poVar7 = local_49f8 + uVar40;
            (poVar7->transform).m10 = local_4938[0].m10;
            (poVar7->transform).m11 = local_4938[0].m11;
            *(undefined8 *)(&(poVar7->transform).m10 + 2) = local_4938[0]._24_8_;
            poVar7 = local_49f8 + uVar40;
            (poVar7->transform).m20 = local_4938[0].m20;
            (poVar7->transform).m21 = local_4938[0].m21;
            *(undefined8 *)(&(poVar7->transform).m20 + 2) = local_4938[0]._40_8_;
            local_49f8[uVar40].transform.m30 = fVar44;
            local_49f8[uVar40].transform.m31 = (float)(undefined4)local_49d8;
            local_49f8[uVar40].transform.m32 = (float)local_49d8._4_4_;
            local_49f8[uVar40].transform.m33 = local_49d0;
            local_49f8[uVar40].parent_group_index = uVar30;
            local_49f8[uVar40].layer_index = 0;
            pbVar2 = &local_49f8[uVar40].hidden;
            *(float *)pbVar2 = local_4978.m00;
            *(float *)(pbVar2 + 4) = local_4978.m01;
            *(float *)&((ogt_vox_anim_transform *)(pbVar2 + 8))->keyframes = local_4978.m02;
            *(float *)(pbVar2 + 0xc) = local_4978.m03;
            puVar36 = &local_49f8[uVar40].transform_anim.num_keyframes;
            *puVar36 = (uint32_t)local_4a38;
            puVar36[1] = local_4a38._4_4_;
            uVar21 = uVar21 + 1;
            uVar31 = (ulong)local_4a78->num_groups;
            lVar27 = lVar27 + 0x68;
            poVar26 = local_4a78;
          } while (uVar21 < uVar31);
          uVar40 = *local_49f0;
          iVar20 = (int)local_4a60 + (int)uVar21 + -1;
        }
        local_4a38 = CONCAT44(local_4a38._4_4_,iVar20);
        if (uVar40 != 0) {
          local_4a60 = (ulong)((int)local_4a60 - 1);
          lVar27 = 0;
          uVar31 = 0;
          do {
            if (poVar26->num_groups <= *(uint *)((long)&poVar26->instances->group_index + lVar27)) {
              __assert_fail("(src_instance->group_index < scene->num_groups) && (\"group index is out of bounds\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                            ,0xbed,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            uVar21 = (ulong)local_4a7c;
            local_4a7c = local_4a7c + 1;
            poVar16 = local_4a50 + uVar21;
            puVar34 = (undefined8 *)((long)&poVar26->instances->name + lVar27);
            poVar37 = poVar16;
            for (lVar29 = 0xf; lVar29 != 0; lVar29 = lVar29 + -1) {
              poVar37->name = (char *)*puVar34;
              puVar34 = puVar34 + (ulong)bVar42 * -2 + 1;
              poVar37 = (ogt_vox_instance *)((long)poVar37 + (ulong)bVar42 * -0x10 + 8);
            }
            local_4a50[uVar21].layer_index = 0;
            uVar30 = (int)local_4a60 + local_4a50[uVar21].group_index;
            if (local_4a50[uVar21].group_index == 0) {
              uVar30 = 0;
            }
            local_4a50[uVar21].group_index = uVar30;
            local_4a50[uVar21].model_index = local_4a50[uVar21].model_index + local_4a3c;
            if (local_4a50[uVar21].name != (char *)0x0) {
              sVar25 = strlen(local_4a50[uVar21].name);
              local_4a70 = local_4a70 + sVar25 + 1;
            }
            uVar40 = (poVar16->transform_anim).num_keyframes;
            uVar35 = (poVar16->model_anim).num_keyframes;
            if (uVar30 == 0) {
              (poVar16->transform).m30 = (poVar16->transform).m30 + fVar43;
            }
            local_4a70 = (ulong)uVar40 * 0x44 + local_4a70 + (ulong)uVar35 * 8;
            uVar31 = uVar31 + 1;
            lVar27 = lVar27 + 0x78;
            poVar26 = local_4a78;
          } while (uVar31 < *local_49f0);
        }
        local_4a28 = (ulong)((int)local_4a28 + (int)fVar39 + 4);
        local_4a60 = local_4a38 & 0xffffffff;
      }
      uVar31 = local_4a08 + 1;
      uVar40 = (uint)local_4a60;
    } while (uVar31 != local_49e8);
  }
  if ((uint)uVar33 < 0x100) {
    do {
      uVar33 = uVar33 + 1;
      (&uStack_483c)[uVar33] = 0xffff00ff;
    } while ((int)uVar33 != 0x100);
  }
  __n = local_4a70 + 0x4440;
  if ((__n == 0) ||
     (poVar26 = (ogt_vox_scene *)(*g_alloc_func)(__n), poVar26 == (ogt_vox_scene *)0x0)) {
    poVar26 = (ogt_vox_scene *)0x0;
  }
  else {
    memset(poVar26,0,__n);
  }
  __dest = poVar26 + 1;
  local_4a78 = __dest;
  local_4a48 = poVar26;
  if (local_4a7c != 0) {
    uVar31 = 0;
    do {
      poVar16 = local_4a50 + uVar31;
      pcVar8 = local_4a50[uVar31].name;
      poVar26 = __dest;
      if (pcVar8 != (char *)0x0) {
        sVar25 = strlen(pcVar8);
        memcpy(__dest,pcVar8,sVar25 + 1);
        poVar16->name = (char *)__dest;
        poVar26 = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + 1 + sVar25);
      }
      uVar30 = (poVar16->model_anim).num_keyframes;
      __dest = poVar26;
      if (uVar30 != 0) {
        uVar33 = (ulong)(uVar30 << 3);
        memcpy(poVar26,(poVar16->model_anim).keyframes,uVar33);
        (poVar16->model_anim).keyframes = (ogt_vox_keyframe_model *)poVar26;
        __dest = (ogt_vox_scene *)((long)((poVar26->palette).color + -0xc) + uVar33);
        uVar33 = local_49c8.count & 0xffffffff;
        do {
          uVar33 = uVar33 - 1;
          if ((int)(uint)uVar33 < 0) goto LAB_00108914;
          uVar21 = (ulong)((uint)uVar33 & 0x7fffffff);
          if (local_49c8.count <= uVar21) goto LAB_00108ae1;
        } while (uVar31 < local_49c8.data[uVar21]);
        uVar33 = (ulong)(poVar16->model_anim).num_keyframes;
        if (uVar33 != 0) {
          if (local_49a8.count <= uVar21) {
LAB_00108ae1:
            __assert_fail("(index < count) && (\"index out of bounds\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                          ,0x324,
                          "T &_vox_array<unsigned int>::operator[](size_t) [T = unsigned int]");
          }
          uVar32 = 0;
          do {
            poVar3 = (poVar26->palette).color + uVar32 * 2 + -0xb;
            *poVar3 = (ogt_vox_rgba)((int)*poVar3 + local_49a8.data[uVar21]);
            uVar32 = uVar32 + 1;
          } while (uVar33 != uVar32);
        }
      }
LAB_00108914:
      uVar30 = (poVar16->transform_anim).num_keyframes;
      if (uVar30 != 0) {
        uVar33 = (ulong)(uVar30 * 0x44);
        memcpy(__dest,(poVar16->transform_anim).keyframes,uVar33);
        (poVar16->transform_anim).keyframes = (ogt_vox_keyframe_transform *)__dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + uVar33);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 < local_4a7c);
  }
  poVar7 = local_49f8;
  local_4a38 = CONCAT44(local_4a38._4_4_,uVar40);
  if (uVar40 != 0) {
    lVar27 = 0;
    do {
      pcVar8 = *(char **)((long)&poVar7->name + lVar27);
      if (pcVar8 != (char *)0x0) {
        sVar25 = strlen(pcVar8);
        memcpy(__dest,pcVar8,sVar25 + 1);
        *(ogt_vox_scene **)((long)&poVar7->name + lVar27) = __dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + 1 + sVar25);
      }
      iVar20 = *(int *)((long)&(poVar7->transform_anim).num_keyframes + lVar27);
      if (iVar20 != 0) {
        uVar31 = (ulong)(uint)(iVar20 * 0x44);
        memcpy(__dest,*(void **)((long)&(poVar7->transform_anim).keyframes + lVar27),uVar31);
        *(ogt_vox_scene **)((long)&(poVar7->transform_anim).keyframes + lVar27) = __dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + uVar31);
      }
      lVar27 = lVar27 + 0x68;
    } while ((ulong)uVar40 * 0x68 - lVar27 != 0);
  }
  poVar26 = local_4a48;
  if ((ogt_vox_scene *)((long)((local_4a78->palette).color + -0xc) + local_4a70) < __dest) {
    __assert_fail("(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size)) && (\"misc_data allocation was overrun\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc3c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  if (local_4a84 < (uint32_t)local_4a38) {
    __assert_fail("(num_groups <= max_groups) && (\"sanity check failed. we wrote more groups than we allocated\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0xc3f,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  *(undefined8 *)&local_4a48->num_cameras = 0;
  local_4a48->cameras = (ogt_vox_cam *)0x0;
  local_4a48->instances = local_4a50;
  local_4a48->num_instances = (uint32_t)local_4a58;
  local_4a48->models = local_4a18;
  local_4a48->num_models = (uint32_t)local_4a10;
  local_4a48->layers = local_4988;
  local_4a48->num_layers = 1;
  local_4a48->groups = local_49f8;
  local_4a48->num_groups = (uint32_t)local_4a38;
  memcpy(&local_4a48->palette,&local_4838,0x400);
  memcpy(&poVar26->materials,local_4038,0x4000);
  if (local_49c8.data != (uint *)0x0) {
    (*g_free_func)(local_49c8.data);
  }
  if (local_49a8.data != (uint *)0x0) {
    (*g_free_func)(local_49a8.data);
  }
  return poVar26;
}

Assistant:

ogt_vox_scene* ogt_vox_merge_scenes(const ogt_vox_scene** scenes, uint32_t scene_count, const ogt_vox_rgba* required_colors, const uint32_t required_color_count) {
        ogt_assert(required_color_count <= 255, "too many colors specified"); // can't exceed the maximum colors in the master palette plus the empty slot.

        // initialize the master palette. If required colors are specified, map them into the master palette now.
        ogt_vox_rgba  master_palette[256];
        ogt_vox_matl materials[256];
        uint32_t master_palette_count = 1;          // color_index 0 is reserved for empty color!
        memset(&master_palette, 0, sizeof(master_palette));
        memset(&materials, 0, sizeof(materials));
        for (uint32_t required_index = 0; required_index < required_color_count; required_index++)
            master_palette[master_palette_count++] = required_colors[required_index];

        // count the number of required models, instances in the master scene
        uint32_t max_layers = 1;  // we don't actually merge layers. Every instance will be in layer 0.
        uint32_t max_models = 0;
        uint32_t max_instances = 0;
        uint32_t max_groups = 1;  // we add 1 root global group that everything will ultimately be parented to.
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            if (!scenes[scene_index])
                continue;
            max_instances += scenes[scene_index]->num_instances;
            max_models += scenes[scene_index]->num_models;
            max_groups += scenes[scene_index]->num_groups;
        }

        // allocate the master instances array
        ogt_vox_instance* instances     = (ogt_vox_instance*)_vox_malloc(sizeof(ogt_vox_instance) * max_instances);
        ogt_vox_model**   models        = (ogt_vox_model**)_vox_malloc(sizeof(ogt_vox_model*) * max_models);
        ogt_vox_layer*    layers        = (ogt_vox_layer*)_vox_malloc(sizeof(ogt_vox_layer) * max_layers);
        ogt_vox_group*    groups        = (ogt_vox_group*)_vox_malloc(sizeof(ogt_vox_group) * max_groups);
        uint32_t          num_instances = 0;
        uint32_t          num_models    = 0;
        uint32_t          num_layers    = 0;

        // add a single layer.
        layers[num_layers].hidden = false;
        layers[num_layers].color  = {255, 255, 255, 255};
        layers[num_layers].name = "merged";
        num_layers++;

        // magicavoxel expects exactly 1 root group, so if we have multiple scenes with multiple roots,
        // we must ensure all merged scenes are parented to the same root group. Allocate it now for the
        // merged scene.
        uint32_t global_root_group_index = 0;
        {
            ogt_vox_group root_group;
            root_group.name                    = NULL;
            root_group.hidden                  = false;
            root_group.layer_index             = 0;
            root_group.parent_group_index      = k_invalid_group_index;
            root_group.transform               = ogt_vox_transform_get_identity();
            clear_anim_transform(&root_group.transform_anim);
            groups[0] = root_group;
        }
        uint32_t num_groups = 1; // we just wrote the global root group index, so all per-scene groups are allocated after.

        // go ahead and do the merge now!
        _vox_array<uint32_t> per_scene_base_model_index;
        _vox_array<uint32_t> per_scene_base_instance_index;
        size_t misc_data_size = 0;
        int32_t offset_x = 0;
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            const ogt_vox_scene* scene = scenes[scene_index];
            if (!scene)
                continue;

            // update the master palette, and get the map of this scene's color indices into the master palette.
            uint32_t scene_color_index_to_master_map[256];
            update_master_palette_and_materials_from_scene(master_palette, master_palette_count, scene, scene_color_index_to_master_map, materials);

            // cache away the base model index for this scene.
            uint32_t base_model_index = num_models;
            uint32_t base_group_index = num_groups;

            per_scene_base_model_index.push_back(base_model_index);
            per_scene_base_instance_index.push_back(num_instances);

            // create copies of all models that have color indices remapped.
            for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
                const ogt_vox_model* model = scene->models[model_index];
                uint32_t voxel_count = model->size_x * model->size_y * model->size_z;
                // clone the model
                ogt_vox_model* override_model = (ogt_vox_model*)_vox_malloc(sizeof(ogt_vox_model) + voxel_count);
                uint8_t * override_voxel_data = (uint8_t*)& override_model[1];

                // remap all color indices in the cloned model so they reference the master palette now!
                for (uint32_t voxel_index = 0; voxel_index < voxel_count; voxel_index++) {
                    uint8_t  old_color_index = model->voxel_data[voxel_index];
                    uint32_t new_color_index = scene_color_index_to_master_map[old_color_index];
                    ogt_assert(new_color_index < 256, "color index out of bounds");
                    override_voxel_data[voxel_index] = (uint8_t)new_color_index;
                }
                // assign the new model.
                *override_model = *model;
                override_model->voxel_data = override_voxel_data;
                override_model->voxel_hash = _vox_hash(override_voxel_data, voxel_count);

                models[num_models++] = override_model;
            }

            // compute the scene bounding box on x dimension. this is used to offset instances
            // and groups in the merged model along X dimension such that they do not overlap
            // with instances from another scene in the merged model.
            int32_t scene_min_x, scene_max_x;
            compute_scene_bounding_box_x(scene, scene_min_x, scene_max_x);
            float scene_offset_x = (float)(offset_x - scene_min_x);

            // each scene has a root group, and it must the 0th group in its local groups[] array,
            ogt_assert(scene->groups[0].parent_group_index == k_invalid_group_index, "first group of scene must not be parented to any other group");
            // create copies of all groups into the merged scene (except the root group from each scene -- which is why we start group_index at 1 here)
            for (uint32_t group_index = 1; group_index < scene->num_groups; group_index++) {
                const ogt_vox_group* src_group = &scene->groups[group_index];
                ogt_assert(src_group->parent_group_index != k_invalid_group_index, "all groups after the first in the scene must be parented to a valid group"); // there can be only 1 root group per scene and it must be the 0th group.
                ogt_vox_group dst_group = *src_group;
                ogt_assert(dst_group.parent_group_index < scene->num_groups, "group index is out of bounds");
                dst_group.layer_index        = 0;
                dst_group.parent_group_index = (dst_group.parent_group_index == 0) ? global_root_group_index : base_group_index + (dst_group.parent_group_index - 1);
                if (dst_group.name)
                    misc_data_size += _vox_strlen(dst_group.name) + 1; // + 1 for zero terminator
                if (dst_group.transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_group.transform_anim.num_keyframes);
                // if this group belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_group.parent_group_index == global_root_group_index)
                    dst_group.transform.m30 += scene_offset_x;
                groups[num_groups++] = dst_group;
            }

            // create copies of all instances (and bias them such that minimum on x starts at zero)
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* src_instance = &scene->instances[instance_index];
                ogt_assert(src_instance->group_index < scene->num_groups, "group index is out of bounds");  // every instance must be mapped to a group.
                ogt_vox_instance* dst_instance = &instances[num_instances++];
                *dst_instance = *src_instance;
                dst_instance->layer_index = 0;
                dst_instance->group_index = (dst_instance->group_index == 0) ? global_root_group_index : base_group_index + (dst_instance->group_index - 1);
                dst_instance->model_index += base_model_index;
                if (dst_instance->name)
                    misc_data_size += _vox_strlen(dst_instance->name) + 1; // + 1 for zero terminator
                if (dst_instance->transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_instance->transform_anim.num_keyframes);
                if (dst_instance->model_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_model) * dst_instance->model_anim.num_keyframes);

                // if this instance belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_instance->group_index == global_root_group_index)
                    dst_instance->transform.m30 += scene_offset_x;
            }

            offset_x += (scene_max_x - scene_min_x); // step the width of the scene in x dimension
            offset_x += 4;                           // a margin of this many voxels between scenes
        }

        // fill any unused master palette entries with purple/invalid color.
        const ogt_vox_rgba k_invalid_color = { 255, 0, 255, 255 };  // purple = invalid
        for (uint32_t color_index = master_palette_count; color_index < 256; color_index++)
            master_palette[color_index] = k_invalid_color;

        // assign the master scene on output. misc_data is part of the scene allocation.
        size_t scene_size = sizeof(ogt_vox_scene) + misc_data_size;
        ogt_vox_scene * merged_scene = (ogt_vox_scene*)_vox_calloc(scene_size);

        // copy name and keyframe data into the misc_data section and make instances/groups point to it.
        // This makes the merged model self-contained.
        {
            char* scene_misc_data = (char*)&merged_scene[1];
            for (uint32_t instance_index = 0; instance_index < num_instances; instance_index++) {
                if (instances[instance_index].name) {
                    size_t string_len = _vox_strlen(instances[instance_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, instances[instance_index].name, string_len);
                    instances[instance_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (instances[instance_index].model_anim.num_keyframes) {
                    ogt_vox_keyframe_model* model_keyframes = (ogt_vox_keyframe_model*)scene_misc_data;
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_model) * instances[instance_index].model_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].model_anim.keyframes, keyframe_size);
                    instances[instance_index].model_anim.keyframes = model_keyframes;
                    scene_misc_data += keyframe_size;
                    // bias the model_index in model_keyframes back into the range for the scene that this instance came from.
                    for (int32_t scene_index = (int32_t)(per_scene_base_instance_index.size() - 1); scene_index >= 0; scene_index--) {
                        if (instance_index >= per_scene_base_instance_index[scene_index]) {
                            for (uint32_t j = 0; j < instances[instance_index].model_anim.num_keyframes; j++)
                                model_keyframes[j].model_index += per_scene_base_model_index[scene_index];
                            break;
                        }
                    }
                }
                if (instances[instance_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * instances[instance_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].transform_anim.keyframes, keyframe_size);
                    instances[instance_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }
            for (uint32_t group_index = 0; group_index < num_groups; group_index++) {
                if (groups[group_index].name) {
                    size_t string_len = _vox_strlen(groups[group_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, groups[group_index].name, string_len);
                    groups[group_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (groups[group_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * groups[group_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, groups[group_index].transform_anim.keyframes, keyframe_size);
                    groups[group_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }

            ogt_assert(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size), "misc_data allocation was overrun");
        }

        ogt_assert(num_groups <= max_groups, "sanity check failed. we wrote more groups than we allocated");

        memset(merged_scene, 0, sizeof(ogt_vox_scene));
        merged_scene->instances     = instances;
        merged_scene->num_instances = max_instances;
        merged_scene->models        = (const ogt_vox_model * *)models;
        merged_scene->num_models    = max_models;
        merged_scene->layers        = layers;
        merged_scene->num_layers    = max_layers;
        merged_scene->groups        = groups;
        merged_scene->num_groups    = num_groups;
        // copy color palette into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene->palette.color[color_index] = master_palette[color_index];
        // copy materials into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene-> materials.matl[color_index] = materials[color_index];

        return merged_scene;
    }